

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::getComponent<tcu::Vector<float,3>>
          (Functions *this,ExprP<tcu::Vector<float,_3>_> *container,int ndx)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_> SStack_28;
  int local_14;
  
  local_14 = ndx;
  constant<int>((BuiltinPrecisionTests *)&SStack_28,&local_14);
  voidP();
  voidP();
  app<deqp::gls::BuiltinPrecisionTests::Functions::GetComponent<tcu::Vector<float,3>>>
            ((BuiltinPrecisionTests *)this,container,(ExprP<int> *)&SStack_28,&voidP::singleton,
             &voidP::singleton);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>::release(&SStack_28);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<typename T::Element> getComponent (const ExprP<T>& container, int ndx)
{
	DE_ASSERT(0 <= ndx && ndx < T::SIZE);
	return app<GetComponent<T> >(container, constant(ndx));
}